

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O0

void narrow_thin_box(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color FVar1;
  uchar *puVar2;
  uchar *g;
  Fl_Color c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  if ((0 < h) && (0 < w)) {
    puVar2 = fl_gray_ramp();
    FVar1 = shade_color(puVar2[0x52],c);
    fl_color(FVar1);
    fl_rectf(x + 1,y + 1,w + -2,h + -2);
    FVar1 = shade_color(puVar2[0x49],c);
    fl_color(FVar1);
    if (1 < w) {
      fl_xyline(x + 1,y,x + w + -2);
      fl_xyline(x + 1,y + h + -1,x + w + -2);
    }
    if (1 < h) {
      fl_yxline(x,y + 1,y + h + -2);
      fl_yxline(x + w + -1,y + 1,y + h + -2);
    }
  }
  return;
}

Assistant:

static void narrow_thin_box(int x, int y, int w, int h, Fl_Color c) {
  if (h<=0 || w<=0) return;
  const uchar *g = fl_gray_ramp();
  fl_color(shade_color(g[(int)'R'], c));
  fl_rectf(x+1, y+1, w-2, h-2);
  fl_color(shade_color(g[(int)'I'], c));
  if (w > 1) {
    fl_xyline(x+1, y, x+w-2);
    fl_xyline(x+1, y+h-1, x+w-2);
  }
  if (h > 1) {
    fl_yxline(x, y+1, y+h-2);
    fl_yxline(x+w-1, y+1, y+h-2);
  }
}